

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

ImfLut * ImfNewRoundNBitLut(uint n,int channels)

{
  ImfLut *pIVar1;
  RgbaChannels in_EDI;
  roundNBit unaff_retaddr;
  exception *e;
  roundNBit local_20 [5];
  RgbaLut *in_stack_fffffffffffffff8;
  
  pIVar1 = (ImfLut *)operator_new(0x10);
  Imf_3_4::roundNBit::roundNBit(local_20,in_EDI);
  Imf_3_4::RgbaLut::RgbaLut<Imf_3_4::roundNBit>(in_stack_fffffffffffffff8,unaff_retaddr,in_EDI);
  return pIVar1;
}

Assistant:

ImfLut*
ImfNewRoundNBitLut (unsigned int n, int channels)
{
    try
    {
        return (ImfLut*) new OPENEXR_IMF_INTERNAL_NAMESPACE::RgbaLut (
            OPENEXR_IMF_INTERNAL_NAMESPACE::roundNBit (n),
            OPENEXR_IMF_INTERNAL_NAMESPACE::RgbaChannels (channels));
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}